

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_refs_pushptr(MTBDD *ptr)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  while (lVar3 = *(long *)(in_FS_OFFSET + -0x18), lVar3 == 0) {
    mtbdd_refs_init_key();
  }
  puVar1 = *(undefined8 **)(lVar3 + 0x10);
  *(undefined8 **)(lVar3 + 0x10) = puVar1 + 1;
  *puVar1 = ptr;
  puVar1 = *(undefined8 **)(in_FS_OFFSET + -0x18);
  if (puVar1[2] == puVar1[1]) {
    lVar3 = puVar1[2] - (long)*puVar1;
    pvVar2 = realloc((void *)*puVar1,lVar3 * 2);
    *puVar1 = pvVar2;
    puVar1[2] = (long)pvVar2 + lVar3;
    puVar1[1] = (void *)((long)pvVar2 + lVar3 * 2);
  }
  return;
}

Assistant:

void __attribute__((unused))
mtbdd_refs_pushptr(const MTBDD *ptr)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    if (mtbdd_refs_key == 0) {
        mtbdd_refs_init_key();
        mtbdd_refs_pushptr(ptr);
    } else {
        *mtbdd_refs_key->pcur++ = ptr;
        if (mtbdd_refs_key->pcur == mtbdd_refs_key->pend) mtbdd_refs_ptrs_up(mtbdd_refs_key);
    }
}